

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

SRes SzReadFileNames(Byte *data,size_t size,UInt32 numFiles,size_t *offsets)

{
  size_t sVar1;
  size_t *psVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  
  *offsets = 0;
  if (numFiles == 0) {
    bVar5 = size == 0;
  }
  else {
    if (((size < 2) || (data[size - 2] != '\0')) || (data[size - 1] != '\0')) {
      return 0x10;
    }
    psVar2 = offsets + 1;
    sVar3 = 0;
    do {
      uVar4 = sVar3;
      if (sVar3 != size) {
        do {
          do {
            sVar1 = uVar4;
            uVar4 = sVar1 + 2;
          } while (data[sVar1] != '\0');
        } while (data[sVar1 + 1] != '\0');
        *psVar2 = uVar4 >> 1;
        psVar2 = psVar2 + 1;
      }
      if (sVar3 == size) {
        return 0x10;
      }
      numFiles = numFiles - 1;
      sVar3 = uVar4;
    } while (numFiles != 0);
    bVar5 = uVar4 == size;
  }
  return (uint)!bVar5 << 4;
}

Assistant:

static SRes SzReadFileNames(const Byte *data, size_t size, UInt32 numFiles, size_t *offsets)
{
  size_t pos = 0;
  *offsets++ = 0;
  if (numFiles == 0)
    return (size == 0) ? SZ_OK : SZ_ERROR_ARCHIVE;
  if (size < 2)
    return SZ_ERROR_ARCHIVE;
  if (data[size - 2] != 0 || data[size - 1] != 0)
    return SZ_ERROR_ARCHIVE;
  do
  {
    const Byte *p;
    if (pos == size)
      return SZ_ERROR_ARCHIVE;
    for (p = data + pos;
      #ifdef _WIN32
      *(const UInt16 *)p != 0
      #else
      p[0] != 0 || p[1] != 0
      #endif
      ; p += 2);
    pos = p - data + 2;
    *offsets++ = (pos >> 1);
  }
  while (--numFiles);
  return (pos == size) ? SZ_OK : SZ_ERROR_ARCHIVE;
}